

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)

{
  long local_40;
  PHYSFS_File *local_38;
  PHYSFS_sint64 retval_1;
  PHYSFS_sint64 retval;
  PHYSFS_sint64 pos;
  FileHandle *fh;
  PHYSFS_File *handle_local;
  
  pos = (PHYSFS_sint64)handle;
  fh = (FileHandle *)handle;
  if (handle->opaque == (void *)0x0) {
    if ((magicStream == (FileHandle *)0x0) || (magicStream->forReading == '\0')) {
      handle_local = (PHYSFS_File *)0x0;
    }
    else {
      PHYSFS_readBytes((PHYSFS_File *)magicStream,&local_38,8);
      handle_local = local_38;
    }
  }
  else {
    retval = (**(code **)((long)handle->opaque + 0x28))(handle->opaque);
    if (*(char *)(pos + 8) == '\0') {
      local_40 = retval + *(long *)(pos + 0x28);
    }
    else {
      local_40 = (retval - *(long *)(pos + 0x28)) + *(long *)(pos + 0x30);
    }
    retval_1 = local_40;
    if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading == '\0')) {
      PHYSFS_writeBytes((PHYSFS_File *)magicStream,&retval_1,8);
    }
    handle_local = (PHYSFS_File *)retval_1;
  }
  return (PHYSFS_sint64)handle_local;
}

Assistant:

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    PHYSFS_sint64 pos;
    PHYSFS_sint64 retval;

    if (fh->io == NULL)
    {
        if (magicStream && magicStream->forReading)
        {
            PHYSFS_sint64 retval;
            PHYSFS_readBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));
            return retval;
        } /* if */
        return 0; /* magic stream opened file but no magic stream open */
    } /* if */

    pos = fh->io->tell(fh->io);
    retval = fh->forReading ?
             (pos - fh->buffill) + fh->bufpos :
             (pos + fh->buffill);

    if (magicStream && !magicStream->forReading)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));

    return retval;
}